

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

string * __thiscall
QPDFCrypto_openssl::SHA2_digest_abi_cxx11_(string *__return_storage_ptr__,QPDFCrypto_openssl *this)

{
  ulong uVar1;
  allocator local_19;
  QPDFCrypto_openssl *local_18;
  QPDFCrypto_openssl *this_local;
  
  uVar1 = this->sha2_bits;
  local_18 = this;
  this_local = (QPDFCrypto_openssl *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)this->md_out,uVar1 >> 3,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFCrypto_openssl::SHA2_digest()
{
    return {reinterpret_cast<char*>(md_out), sha2_bits / 8};
}